

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  long lStack_420;
  uint32_t res;
  size_t n;
  char input [1024];
  char **argv_local;
  int argc_local;
  
  input._1016_8_ = argv;
  printf("Please enter a roman numerals: ");
  pcVar3 = fgets((char *)&n,0x400,_stdin);
  if (pcVar3 != (char *)0x0) {
    lStack_420 = 0;
    while( true ) {
      bVar5 = false;
      if (input[lStack_420 + -8] != '\0') {
        bVar5 = input[lStack_420 + -8] != '\n';
      }
      if (!bVar5) {
        sVar4 = strlen((char *)&n);
        uVar2 = roman_to_decimal((char *)&n,sVar4 - 1);
        printf("%u\n",(ulong)uVar2);
        return 0;
      }
      iVar1 = (int)input[lStack_420 + -8];
      if ((((1 < iVar1 - 0x43U) && (iVar1 != 0x49)) && (1 < iVar1 - 0x4cU)) &&
         ((iVar1 != 0x56 && (iVar1 != 0x58)))) break;
      lStack_420 = lStack_420 + 1;
    }
    printf("Invalid roman number!\n");
  }
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  char input[1024];
  printf("Please enter a roman numerals: ");
  if (fgets(input, sizeof input, stdin) == NULL) return 1;

  for (size_t n = 0; input[n] != 0 && input[n] != '\n'; n++) {
    switch (input[n]) {
      case 'I':
      case 'V':
      case 'X':
      case 'L':
      case 'C':
      case 'D':
      case 'M':
        // noop
        break;
      default:
        printf("Invalid roman number!\n");
        return 1;
    }
  }

  uint32_t res = roman_to_decimal(input, strlen(input) - 1);
  printf("%" PRIu32 "\n", res);
  return 0;
}